

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O2

void __thiscall BrokerSendMessage_TwoParts_Test::TestBody(BrokerSendMessage_TwoParts_Test *this)

{
  uint32_t uVar1;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *pTVar2;
  ReturnAction<bool> RStack_448;
  undefined1 local_438 [16];
  char local_428 [16];
  MatcherBase<const_pstore::brokerface::message_type_&> local_418;
  Action<bool_(const_pstore::brokerface::message_type_&)> local_400;
  string path;
  string verb;
  mock_writer wr;
  EqMatcher<pstore::brokerface::message_type> local_318;
  message_type expected2;
  message_type expected1;
  
  std::__cxx11::string::string((string *)&verb,"verb",(allocator *)&expected1);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  std::__cxx11::string::_M_construct((ulong)&path,-0xc - (char)verb._M_string_length);
  anon_unknown.dwarf_4131e::mock_writer::mock_writer(&wr);
  uVar1 = (this->super_BrokerSendMessage).message_id_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                 &verb,' ');
  local_438._0_8_ = local_428;
  std::__cxx11::string::_M_construct((ulong)local_438,-0xd - (char)verb._M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expected2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
  pstore::brokerface::message_type::message_type(&expected1,uVar1,0,2,(string *)&expected2);
  std::__cxx11::string::~string((string *)&expected2);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::~string((string *)&local_318);
  uVar1 = (this->super_BrokerSendMessage).message_id_;
  local_318.
  super_ComparisonBase<testing::internal::EqMatcher<pstore::brokerface::message_type>,_pstore::brokerface::message_type,_testing::internal::AnyEq>
  .rhs_._0_8_ = local_318.
                super_ComparisonBase<testing::internal::EqMatcher<pstore::brokerface::message_type>,_pstore::brokerface::message_type,_testing::internal::AnyEq>
                .rhs_.payload._M_elems + 4;
  std::__cxx11::string::_M_construct((ulong)&local_318,'\x01');
  pstore::brokerface::message_type::message_type(&expected2,uVar1,1,2,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  memcpy(&local_318,&expected1,0x100);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_418,&local_318);
  anon_unknown.dwarf_4131e::mock_writer::gmock_write_impl
            ((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_438,&wr,
             (Matcher<const_pstore::brokerface::message_type_&> *)&local_418);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_438
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x51,"wr","write_impl (Eq (expected1))");
  testing::internal::ReturnAction<bool>::ReturnAction(&RStack_448,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_400,(ReturnAction *)&RStack_448);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar2,&local_400);
  std::_Function_base::~_Function_base((_Function_base *)&local_400);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_448.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)(local_438 + 8));
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_418)
  ;
  memcpy(&local_318,&expected2,0x100);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_418,&local_318);
  anon_unknown.dwarf_4131e::mock_writer::gmock_write_impl
            ((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_438,&wr,
             (Matcher<const_pstore::brokerface::message_type_&> *)&local_418);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_438
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x52,"wr","write_impl (Eq (expected2))");
  testing::internal::ReturnAction<bool>::ReturnAction(&RStack_448,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_400,(ReturnAction *)&RStack_448);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar2,&local_400);
  std::_Function_base::~_Function_base((_Function_base *)&local_400);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_448.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)(local_438 + 8));
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_418)
  ;
  pstore::brokerface::send_message
            (&wr.super_writer,true,verb._M_dataplus._M_p,path._M_dataplus._M_p);
  anon_unknown.dwarf_4131e::mock_writer::~mock_writer(&wr);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&verb);
  return;
}

Assistant:

TEST_F (BrokerSendMessage, TwoParts) {
    using ::testing::Eq;
    using ::testing::Return;

    std::string const verb = "verb";
    auto const part1_chars = pstore::brokerface::message_type::payload_chars - verb.length () - 1U;

    // Increase the length by 1 to cause the payload to overflow into a second message.
    std::string::size_type const payload_length = part1_chars + 1U;
    std::string const path (payload_length, 'p');

    auto const part2_chars = payload_length - part1_chars;

    mock_writer wr;

    pstore::brokerface::message_type const expected1 (message_id_, 0, 2,
                                                      verb + ' ' + std::string (part1_chars, 'p'));
    pstore::brokerface::message_type const expected2 (message_id_, 1, 2,
                                                      std::string (part2_chars, 'p'));
    EXPECT_CALL (wr, write_impl (Eq (expected1))).WillOnce (Return (true));
    EXPECT_CALL (wr, write_impl (Eq (expected2))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, verb.c_str (), path.c_str ());
}